

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  uint uVar1;
  void *pvVar2;
  uint64_t scopeId;
  undefined1 uVar3;
  int iVar4;
  bool bVar5;
  ArrayPtr<const_char> AVar6;
  Fault f;
  anon_class_16_2_3fe397bd _kjContextFunc221;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:221:5)>
  _kjContext221;
  undefined1 local_d8 [48];
  PointerReader local_a8;
  Validator *local_88;
  Reader *local_80;
  undefined1 local_78 [24];
  int local_60;
  Validator **local_30;
  
  this->isValid = true;
  bVar5 = (node->_reader).pointerCount == 0;
  local_78._16_8_ = (node->_reader).pointers;
  if (bVar5) {
    local_78._16_8_ = (WirePointer *)0x0;
  }
  iVar4 = 0x7fffffff;
  local_60 = (node->_reader).nestingLimit;
  if (bVar5) {
    local_60 = 0x7fffffff;
  }
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  if (!bVar5) {
    local_78._0_4_ = *(undefined4 *)&(node->_reader).segment;
    local_78._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
    local_78._8_4_ = *(undefined4 *)&(node->_reader).capTable;
    local_78._12_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
  }
  AVar6 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_78,(void *)0x0,0);
  (this->nodeName).super_StringPtr.content = AVar6;
  kj::_::BTreeImpl::clear(&(this->dependencies).table.indexes.impl);
  (this->dependencies).table.rows.builder.pos = (this->dependencies).table.rows.builder.ptr;
  local_88 = this;
  local_80 = node;
  kj::_::Debug::Context::Context((Context *)local_78);
  local_78._0_8_ = &PTR__Context_00207eb8;
  local_a8.pointer = (node->_reader).pointers + 5;
  if ((node->_reader).pointerCount < 6) {
    local_a8.segment._0_4_ = 0;
    local_a8.segment._4_4_ = 0;
    local_a8.capTable._0_4_ = 0;
    local_a8.capTable._4_4_ = 0;
    local_a8.pointer = (WirePointer *)0x0;
  }
  else {
    iVar4 = (node->_reader).nestingLimit;
    local_a8.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
    local_a8.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
    local_a8.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
    local_a8.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
  }
  local_a8.nestingLimit = iVar4;
  local_30 = &local_88;
  _::PointerReader::getList((ListReader *)local_d8,&local_a8,INLINE_COMPOSITE,(word *)0x0);
  uVar1 = (node->_reader).dataSize;
  if (local_d8._24_4_ == 0) {
    if (0x6f < uVar1) goto LAB_00193a50;
  }
  else {
    if ((uVar1 < 0x121) || ((*(byte *)((long)(node->_reader).data + 0x24) & 1) == 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                ((Fault *)local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0xe0,FAILED,"node.getIsGeneric()",
                 "\"if parameter list is non-empty, isGeneric must be true\"",
                 (char (*) [55])"if parameter list is non-empty, isGeneric must be true");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault((Fault *)local_d8);
      uVar3 = 0;
      goto LAB_00193b88;
    }
LAB_00193a50:
    pvVar2 = (node->_reader).data;
    switch(*(undefined2 *)((long)pvVar2 + 0xc)) {
    case 1:
      local_d8._0_8_ = (node->_reader).segment;
      local_d8._8_8_ = (node->_reader).capTable;
      local_d8._16_8_ = (node->_reader).data;
      local_d8._24_8_ = (node->_reader).pointers;
      local_d8._32_4_ = (node->_reader).dataSize;
      local_d8._36_2_ = (node->_reader).pointerCount;
      local_d8[0x26] = (node->_reader).field_0x26;
      local_d8[0x27] = (node->_reader).field_0x27;
      local_d8._40_4_ = (node->_reader).nestingLimit;
      local_d8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      if (uVar1 < 0xc0) {
        scopeId = 0;
      }
      else {
        scopeId = *(uint64_t *)((long)pvVar2 + 0x10);
      }
      validate(this,(Reader *)local_d8,scopeId);
      break;
    case 2:
      local_d8._0_8_ = (node->_reader).segment;
      local_d8._8_8_ = (node->_reader).capTable;
      local_d8._16_8_ = (node->_reader).data;
      local_d8._24_8_ = (node->_reader).pointers;
      local_d8._32_4_ = (node->_reader).dataSize;
      local_d8._36_2_ = (node->_reader).pointerCount;
      local_d8[0x26] = (node->_reader).field_0x26;
      local_d8[0x27] = (node->_reader).field_0x27;
      local_d8._40_4_ = (node->_reader).nestingLimit;
      local_d8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_d8);
      break;
    case 3:
      local_d8._0_8_ = (node->_reader).segment;
      local_d8._8_8_ = (node->_reader).capTable;
      local_d8._16_8_ = (node->_reader).data;
      local_d8._24_8_ = (node->_reader).pointers;
      local_d8._32_4_ = (node->_reader).dataSize;
      local_d8._36_2_ = (node->_reader).pointerCount;
      local_d8[0x26] = (node->_reader).field_0x26;
      local_d8[0x27] = (node->_reader).field_0x27;
      local_d8._40_4_ = (node->_reader).nestingLimit;
      local_d8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_d8);
      break;
    case 4:
      local_d8._0_8_ = (node->_reader).segment;
      local_d8._8_8_ = (node->_reader).capTable;
      local_d8._16_8_ = (node->_reader).data;
      local_d8._24_8_ = (node->_reader).pointers;
      local_d8._32_4_ = (node->_reader).dataSize;
      local_d8._36_2_ = (node->_reader).pointerCount;
      local_d8[0x26] = (node->_reader).field_0x26;
      local_d8[0x27] = (node->_reader).field_0x27;
      local_d8._40_4_ = (node->_reader).nestingLimit;
      local_d8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_d8);
      break;
    case 5:
      local_a8.pointer = (node->_reader).pointers + 3;
      local_a8.nestingLimit = (node->_reader).nestingLimit;
      if ((node->_reader).pointerCount < 4) {
        local_a8.segment._0_4_ = 0;
        local_a8.segment._4_4_ = 0;
        local_a8.capTable._0_4_ = 0;
        local_a8.capTable._4_4_ = 0;
        local_a8.nestingLimit = 0x7fffffff;
        local_a8.pointer = (WirePointer *)0x0;
      }
      else {
        local_a8.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
        local_a8.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
        local_a8.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
        local_a8.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
      }
      _::PointerReader::getStruct((StructReader *)local_d8,&local_a8,(word *)0x0);
      validate(this,(Reader *)local_d8);
    }
  }
  uVar3 = this->isValid;
LAB_00193b88:
  kj::_::Debug::Context::~Context((Context *)local_78);
  return (bool)uVar3;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }